

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayGenerateMipMap.cpp
# Opt level: O0

void __thiscall
glcts::TextureCubeMapArrayGenerateMipMapNonFilterable::deinit
          (TextureCubeMapArrayGenerateMipMapNonFilterable *this)

{
  code *pcVar1;
  int iVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  size_type sVar5;
  reference pvVar6;
  uint local_1c;
  uint n_storage_config;
  Functions *gl;
  TextureCubeMapArrayGenerateMipMapNonFilterable *this_local;
  long lVar4;
  
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar2 = (*pRVar3->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  (**(code **)(lVar4 + 0xb8))(0x9009,0);
  (**(code **)(lVar4 + 0xff0))(0xd05,4);
  (**(code **)(lVar4 + 0xff0))(0xcf5,4);
  local_1c = 0;
  while( true ) {
    sVar5 = std::vector<glcts::StorageConfig,_std::allocator<glcts::StorageConfig>_>::size
                      (&this->m_non_filterable_texture_configs);
    if (sVar5 <= local_1c) break;
    pvVar6 = std::vector<glcts::StorageConfig,_std::allocator<glcts::StorageConfig>_>::operator[]
                       (&this->m_non_filterable_texture_configs,(ulong)local_1c);
    if (pvVar6->m_to_id != 0) {
      pcVar1 = *(code **)(lVar4 + 0x480);
      pvVar6 = std::vector<glcts::StorageConfig,_std::allocator<glcts::StorageConfig>_>::operator[]
                         (&this->m_non_filterable_texture_configs,(ulong)local_1c);
      (*pcVar1)(1,&pvVar6->m_to_id);
      pvVar6 = std::vector<glcts::StorageConfig,_std::allocator<glcts::StorageConfig>_>::operator[]
                         (&this->m_non_filterable_texture_configs,(ulong)local_1c);
      pvVar6->m_to_id = 0;
    }
    local_1c = local_1c + 1;
  }
  TestCaseBase::deinit(&this->super_TestCaseBase);
  return;
}

Assistant:

void TextureCubeMapArrayGenerateMipMapNonFilterable::deinit()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Restore default bindings */
	gl.bindTexture(GL_TEXTURE_CUBE_MAP_ARRAY, 0);

	/* Restore default pixel pack/unpack settings */
	gl.pixelStorei(GL_PACK_ALIGNMENT, 4);
	gl.pixelStorei(GL_UNPACK_ALIGNMENT, 4);

	/* Delete all textures the test may have created. */
	for (unsigned int n_storage_config = 0; n_storage_config < m_non_filterable_texture_configs.size();
		 ++n_storage_config)
	{
		if (m_non_filterable_texture_configs[n_storage_config].m_to_id != 0)
		{
			gl.deleteTextures(1, &m_non_filterable_texture_configs[n_storage_config].m_to_id);

			m_non_filterable_texture_configs[n_storage_config].m_to_id = 0;
		}
	}

	/* Call base class' deinit() implementation */
	TestCaseBase::deinit();
}